

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_NtkFindRoots(Acb_Ntk_t *p,Vec_Int_t *vTargets,Vec_Bit_t **pvBlock)

{
  uint uVar1;
  Vec_Int_t *p_00;
  Vec_Bit_t *p_01;
  int *piVar2;
  int Entry;
  int iVar3;
  int iVar4;
  size_t __size;
  
  p_00 = Vec_IntAlloc(1000);
  uVar1 = (p->vObjType).nSize - 1;
  iVar4 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  p_01 = (Vec_Bit_t *)malloc(0x10);
  p_01->nCap = iVar4 * 0x20;
  if (iVar4 == 0) {
    __size = 0;
    piVar2 = (int *)0x0;
  }
  else {
    __size = (long)iVar4 << 2;
    piVar2 = (int *)malloc(__size);
  }
  p_01->pArray = piVar2;
  p_01->nSize = iVar4 * 0x20;
  iVar3 = 0;
  memset(piVar2,0,__size);
  *pvBlock = p_01;
  Acb_NtkIncTravId(p);
  iVar4 = vTargets->nSize;
  if (iVar4 < 1) {
    __assert_fail("Vec_IntSize(vTargets) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                  ,0x1d9,"Vec_Int_t *Acb_NtkFindRoots(Acb_Ntk_t *, Vec_Int_t *, Vec_Bit_t **)");
  }
  for (; iVar3 < iVar4; iVar3 = iVar3 + 1) {
    iVar4 = Vec_IntEntry(vTargets,iVar3);
    Acb_ObjSetTravIdCur(p,iVar4);
    Vec_BitWriteEntry(p_01,iVar4,Entry);
    iVar4 = vTargets->nSize;
  }
  Acb_NtkIncTravId(p);
  for (iVar4 = 0; iVar4 < (p->vCis).nSize; iVar4 = iVar4 + 1) {
    iVar3 = Vec_IntEntry(&p->vCis,iVar4);
    Acb_ObjSetTravIdCur(p,iVar3);
  }
  for (iVar4 = 0; iVar4 < (p->vCos).nSize; iVar4 = iVar4 + 1) {
    iVar3 = Vec_IntEntry(&p->vCos,iVar4);
    piVar2 = Acb_ObjFanins(p,iVar3);
    iVar3 = Acb_NtkFindRoots_rec(p,piVar2[1],p_01);
    if (iVar3 != 0) {
      Vec_IntPush(p_00,iVar4);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindRoots( Acb_Ntk_t * p, Vec_Int_t * vTargets, Vec_Bit_t ** pvBlock )
{
    int i, iObj;
    Vec_Int_t * vRoots = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vBlock = Vec_BitStart( Acb_NtkObjNum(p) );
    *pvBlock = vBlock;
    // mark targets
    Acb_NtkIncTravId( p );
    assert( Vec_IntSize(vTargets) > 0 );
    Vec_IntForEachEntry( vTargets, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        Vec_BitWriteEntry( vBlock, iObj, 1 );
    }
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetTravIdCur( p, iObj );
    // collect outputs reachable from targets
    Acb_NtkForEachCoDriver( p, iObj, i )
        if ( Acb_NtkFindRoots_rec(p, iObj, vBlock) )
            Vec_IntPush( vRoots, i );
    //Vec_IntPrint( vRoots );
    return vRoots;
}